

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trim_capabilities_pass.cpp
# Opt level: O0

void spvtools::opt::(anonymous_namespace)::
     DFSWhile<spvtools::opt::Handler_OpTypePointer_StorageUniform16(spvtools::opt::Instruction_const*)::__0>
               (Instruction *instruction,anon_class_24_3_71d92ec5 condition)

{
  Instruction *pIVar1;
  bool bVar2;
  Op OVar3;
  IRContext *this;
  reference pvVar4;
  anon_class_8_1_0bae9901 local_a8;
  function<void_(const_unsigned_int_*)> local_a0;
  uint32_t local_80;
  uint32_t local_7c;
  Instruction *local_78;
  Instruction *item;
  DefUseManager *def_use_mgr;
  undefined1 local_60 [8];
  stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>
  instructions_to_visit;
  Instruction *instruction_local;
  
  instructions_to_visit.c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)instruction;
  std::stack<unsigned_int,std::deque<unsigned_int,std::allocator<unsigned_int>>>::
  stack<std::deque<unsigned_int,std::allocator<unsigned_int>>,void>
            ((stack<unsigned_int,std::deque<unsigned_int,std::allocator<unsigned_int>>> *)local_60);
  def_use_mgr._4_4_ =
       opt::Instruction::result_id
                 ((Instruction *)
                  instructions_to_visit.c.
                  super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_node);
  std::stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>::push
            ((stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> *)
             local_60,(value_type *)((long)&def_use_mgr + 4));
  this = opt::Instruction::context
                   ((Instruction *)
                    instructions_to_visit.c.
                    super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_node);
  item = (Instruction *)IRContext::get_def_use_mgr(this);
  while (bVar2 = std::stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>
                 ::empty((stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>
                          *)local_60), pIVar1 = item, ((bVar2 ^ 0xffU) & 1) != 0) {
    pvVar4 = std::stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>::top
                       ((stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>
                         *)local_60);
    local_78 = analysis::DefUseManager::GetDef((DefUseManager *)pIVar1,*pvVar4);
    std::stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>::pop
              ((stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               local_60);
    bVar2 = Handler_OpTypePointer_StorageUniform16::anon_class_24_3_71d92ec5::operator()
                      (&condition,local_78);
    if (bVar2) {
      OVar3 = opt::Instruction::opcode(local_78);
      if (OVar3 == OpTypePointer) {
        local_7c = opt::Instruction::GetSingleWordInOperand(local_78,1);
        std::stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>::push
                  ((stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                   local_60,&local_7c);
      }
      else {
        OVar3 = opt::Instruction::opcode(local_78);
        if ((((OVar3 == OpTypeMatrix) ||
             (OVar3 = opt::Instruction::opcode(local_78), OVar3 == OpTypeVector)) ||
            (OVar3 = opt::Instruction::opcode(local_78), OVar3 == OpTypeArray)) ||
           (OVar3 = opt::Instruction::opcode(local_78), OVar3 == OpTypeRuntimeArray)) {
          local_80 = opt::Instruction::GetSingleWordInOperand(local_78,0);
          std::stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>::push
                    ((stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>
                      *)local_60,&local_80);
        }
        else {
          OVar3 = opt::Instruction::opcode(local_78);
          pIVar1 = local_78;
          if (OVar3 == OpTypeStruct) {
            local_a8.instructions_to_visit =
                 (stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 local_60;
            std::function<void(unsigned_int_const*)>::
            function<spvtools::opt::(anonymous_namespace)::DFSWhile<spvtools::opt::Handler_OpTypePointer_StorageUniform16(spvtools::opt::Instruction_const*)::__0>(spvtools::opt::Instruction_const*,spvtools::opt::Handler_OpTypePointer_StorageUniform16(spvtools::opt::Instruction_const*)::__0)::_lambda(unsigned_int_const*)_1_,void>
                      ((function<void(unsigned_int_const*)> *)&local_a0,&local_a8);
            opt::Instruction::ForEachInOperand(pIVar1,&local_a0);
            std::function<void_(const_unsigned_int_*)>::~function(&local_a0);
          }
        }
      }
    }
  }
  std::stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>::~stack
            ((stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> *)
             local_60);
  return;
}

Assistant:

static void DFSWhile(const Instruction* instruction, UnaryPredicate condition) {
  std::stack<uint32_t> instructions_to_visit;
  instructions_to_visit.push(instruction->result_id());
  const auto* def_use_mgr = instruction->context()->get_def_use_mgr();

  while (!instructions_to_visit.empty()) {
    const Instruction* item = def_use_mgr->GetDef(instructions_to_visit.top());
    instructions_to_visit.pop();

    if (!condition(item)) {
      continue;
    }

    if (item->opcode() == spv::Op::OpTypePointer) {
      instructions_to_visit.push(
          item->GetSingleWordInOperand(kTypePointerTypeIdInIndex));
      continue;
    }

    if (item->opcode() == spv::Op::OpTypeMatrix ||
        item->opcode() == spv::Op::OpTypeVector ||
        item->opcode() == spv::Op::OpTypeArray ||
        item->opcode() == spv::Op::OpTypeRuntimeArray) {
      instructions_to_visit.push(
          item->GetSingleWordInOperand(kTypeArrayTypeIndex));
      continue;
    }

    if (item->opcode() == spv::Op::OpTypeStruct) {
      item->ForEachInOperand([&instructions_to_visit](const uint32_t* op_id) {
        instructions_to_visit.push(*op_id);
      });
      continue;
    }
  }
}